

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O0

SRes CZDFileInStream::Read(void *pp,void *buf,size_t *size)

{
  size_t sVar1;
  long numread;
  CZDFileInStream *p;
  size_t *size_local;
  void *buf_local;
  void *pp_local;
  
  sVar1 = (**(code **)(**(long **)((long)pp + 0x10) + 0x10))(*(long **)((long)pp + 0x10),buf,*size);
  if ((long)sVar1 < 0) {
    *size = 0;
    pp_local._4_4_ = 8;
  }
  else {
    *size = sVar1;
    pp_local._4_4_ = 0;
  }
  return pp_local._4_4_;
}

Assistant:

static SRes Read(void *pp, void *buf, size_t *size)
	{
		CZDFileInStream *p = (CZDFileInStream *)pp;
		long numread = p->File->Read(buf, (long)*size);
		if (numread < 0)
		{
			*size = 0;
			return SZ_ERROR_READ;
		}
		*size = numread;
		return SZ_OK;
	}